

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::
swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::double_storage>
          (basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>
           *this,basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>
                 *other)

{
  char_type cVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  pointer phVar4;
  semantic_tag sVar5;
  common_storage cVar6;
  pointer phVar7;
  short_string_storage sStack_28;
  bool_storage temp;
  
  switch((byte)(other->field_0).boolean_ & 0xf) {
  case 0:
  case 4:
    cVar6 = (other->field_0).common_;
    phVar7 = (this->field_0).long_str_.ptr_;
    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
    (other->field_0).long_str_.ptr_ = phVar7;
    goto LAB_00606258;
  case 1:
    cVar1 = (other->field_0).short_str_.data_[0];
    cVar6 = (other->field_0).common_;
    phVar7 = (this->field_0).long_str_.ptr_;
    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
    (other->field_0).long_str_.ptr_ = phVar7;
    (this->field_0).short_str_.data_[0] = cVar1;
LAB_00606258:
    (this->field_0).common_ = cVar6;
    return;
  default:
    uVar3 = *(undefined8 *)&other->field_0;
    phVar7 = (other->field_0).long_str_.ptr_;
    phVar4 = (this->field_0).long_str_.ptr_;
    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
    (other->field_0).long_str_.ptr_ = phVar4;
    *(undefined8 *)&this->field_0 = uVar3;
    (this->field_0).long_str_.ptr_ = phVar7;
    return;
  case 6:
    uVar2 = *(undefined4 *)&other->field_0;
    phVar7 = (this->field_0).long_str_.ptr_;
    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
    (other->field_0).long_str_.ptr_ = phVar7;
    *(undefined4 *)&this->field_0 = uVar2;
    return;
  case 7:
    swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::double_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage>
              ();
    return;
  case 10:
  case 0xb:
    switch((byte)(other->field_0).boolean_ & 0xf) {
    case 0:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::null_storage>
                ();
      return;
    case 1:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::bool_storage>
                ();
      return;
    case 2:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::int64_storage>
                ();
      return;
    case 3:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::uint64_storage>
                ();
      return;
    case 4:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::empty_object_storage>
                ();
      return;
    case 5:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::double_storage>
                ();
      return;
    case 6:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::half_storage>
                ();
      return;
    case 7:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage>
                ();
      return;
    case 8:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::json_const_reference_storage>
                ();
      return;
    case 9:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::json_reference_storage>
                ();
      return;
    case 0xc:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage>
                ();
      return;
    case 0xd:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage>
                ();
      return;
    case 0xe:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage>
                ();
      return;
    case 0xf:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::long_string_storage>
                ();
      return;
    }
    switch((byte)(other->field_0).boolean_ & 0xf) {
    case 0:
    case 4:
      cVar6 = (other->field_0).common_;
      (other->field_0).boolean_ = (bool_storage)0xf;
      (other->field_0).common_.tag_ = (this->field_0).common_.tag_;
      (other->field_0).long_str_.ptr_ = (this->field_0).long_str_.ptr_;
      break;
    case 1:
      cVar1 = (other->field_0).short_str_.data_[0];
      cVar6 = (other->field_0).common_;
      (other->field_0).boolean_ = (bool_storage)0xf;
      (other->field_0).common_.tag_ = (this->field_0).common_.tag_;
      (other->field_0).long_str_.ptr_ = (this->field_0).long_str_.ptr_;
      (this->field_0).short_str_.data_[0] = cVar1;
      break;
    default:
      uVar3 = *(undefined8 *)&other->field_0;
      phVar7 = (other->field_0).long_str_.ptr_;
      (other->field_0).boolean_ = (bool_storage)0xf;
      (other->field_0).common_.tag_ = (this->field_0).common_.tag_;
      (other->field_0).long_str_.ptr_ = (this->field_0).long_str_.ptr_;
      *(undefined8 *)&this->field_0 = uVar3;
      (this->field_0).long_str_.ptr_ = phVar7;
      return;
    case 6:
      uVar2 = *(undefined4 *)&other->field_0;
      (other->field_0).boolean_ = (bool_storage)0xf;
      (other->field_0).common_.tag_ = (this->field_0).common_.tag_;
      (other->field_0).long_str_.ptr_ = (this->field_0).long_str_.ptr_;
      *(undefined4 *)&this->field_0 = uVar2;
      return;
    case 7:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::long_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage>
                ();
      return;
    case 10:
    case 0xb:
      switch((byte)(other->field_0).boolean_ & 0xf) {
      case 0:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::null_storage>
                  ();
        return;
      case 1:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::bool_storage>
                  ();
        return;
      case 2:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::int64_storage>
                  ();
        return;
      case 3:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::uint64_storage>
                  ();
        return;
      case 4:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::empty_object_storage>
                  ();
        return;
      case 5:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::double_storage>
                  ();
        return;
      case 6:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::half_storage>
                  ();
        return;
      case 7:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage>
                  ();
        return;
      case 8:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::json_const_reference_storage>
                  ();
        return;
      case 9:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::json_reference_storage>
                  ();
        return;
      case 0xc:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage>
                  ();
        return;
      case 0xd:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage>
                  ();
        return;
      case 0xe:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage>
                  ();
        return;
      case 0xf:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::long_string_storage>
                  ();
        return;
      }
      switch((byte)(other->field_0).boolean_ & 0xf) {
      case 0:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::null_storage>
                  ();
        return;
      case 1:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::bool_storage>
                  ();
        return;
      case 2:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::int64_storage>
                  ();
        return;
      case 3:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::uint64_storage>
                  ();
        return;
      case 4:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::empty_object_storage>
                  ();
        return;
      case 5:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::double_storage>
                  ();
        return;
      case 6:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::half_storage>
                  ();
        return;
      case 7:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage>
                  ();
        return;
      case 8:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::json_const_reference_storage>
                  ();
        return;
      case 9:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::json_reference_storage>
                  ();
        return;
      default:
        switch((byte)(other->field_0).boolean_ & 0xf) {
        case 0:
          swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::null_storage>
                    ();
          return;
        case 1:
          swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::bool_storage>
                    ();
          return;
        case 2:
          swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::int64_storage>
                    ();
          return;
        case 3:
          swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::uint64_storage>
                    ();
          return;
        case 4:
          swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::empty_object_storage>
                    ();
          return;
        case 5:
          swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::double_storage>
                    ();
          return;
        case 6:
          swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::half_storage>
                    ();
          return;
        case 7:
          swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage>
                    ();
          return;
        case 8:
          swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::json_const_reference_storage>
                    ();
          return;
        case 9:
          swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::json_reference_storage>
                    ();
          return;
        case 0xc:
          swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage>
                    ();
          return;
        case 0xd:
          swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage>
                    ();
          return;
        case 0xe:
          swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage>
                    ();
          return;
        case 0xf:
          swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::long_string_storage>
                    ();
          return;
        }
        break;
      case 0xc:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage>
                  ();
        return;
      case 0xd:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage>
                  ();
        return;
      case 0xe:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage>
                  ();
        return;
      case 0xf:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::long_string_storage>
                  ();
        return;
      }
      switch((byte)(other->field_0).boolean_ & 0xf) {
      case 0:
      case 4:
        cVar6 = (other->field_0).common_;
        phVar7 = (this->field_0).long_str_.ptr_;
        *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
        (other->field_0).long_str_.ptr_ = phVar7;
        goto LAB_00606532;
      case 1:
        cVar1 = (other->field_0).short_str_.data_[0];
        cVar6 = (other->field_0).common_;
        phVar7 = (this->field_0).long_str_.ptr_;
        *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
        (other->field_0).long_str_.ptr_ = phVar7;
        (this->field_0).short_str_.data_[0] = cVar1;
LAB_00606532:
        (this->field_0).common_ = cVar6;
        return;
      default:
        uVar3 = *(undefined8 *)&other->field_0;
        phVar7 = (other->field_0).long_str_.ptr_;
        phVar4 = (this->field_0).long_str_.ptr_;
        *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
        (other->field_0).long_str_.ptr_ = phVar4;
        *(undefined8 *)&this->field_0 = uVar3;
        (this->field_0).long_str_.ptr_ = phVar7;
        return;
      case 6:
        uVar2 = *(undefined4 *)&other->field_0;
        phVar7 = (this->field_0).long_str_.ptr_;
        *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
        (other->field_0).long_str_.ptr_ = phVar7;
        *(undefined4 *)&this->field_0 = uVar2;
        return;
      case 7:
        swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::json_const_reference_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage>
                  ();
        return;
      case 10:
      case 0xb:
        switch((byte)(other->field_0).boolean_ & 0xf) {
        case 0:
        case 4:
          cVar6 = (other->field_0).common_;
          phVar7 = (this->field_0).long_str_.ptr_;
          *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
          (other->field_0).long_str_.ptr_ = phVar7;
          goto LAB_006065ee;
        case 1:
          cVar1 = (other->field_0).short_str_.data_[0];
          cVar6 = (other->field_0).common_;
          phVar7 = (this->field_0).long_str_.ptr_;
          *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
          (other->field_0).long_str_.ptr_ = phVar7;
          (this->field_0).short_str_.data_[0] = cVar1;
LAB_006065ee:
          (this->field_0).common_ = cVar6;
          return;
        default:
          uVar3 = *(undefined8 *)&other->field_0;
          phVar7 = (other->field_0).long_str_.ptr_;
          phVar4 = (this->field_0).long_str_.ptr_;
          *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
          (other->field_0).long_str_.ptr_ = phVar4;
          *(undefined8 *)&this->field_0 = uVar3;
          (this->field_0).long_str_.ptr_ = phVar7;
          return;
        case 6:
          uVar2 = *(undefined4 *)&other->field_0;
          phVar7 = (this->field_0).long_str_.ptr_;
          *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
          (other->field_0).long_str_.ptr_ = phVar7;
          *(undefined4 *)&this->field_0 = uVar2;
          return;
        case 7:
          swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::json_reference_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage>
                    ();
          return;
        case 10:
        case 0xb:
          basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>
          ::short_string_storage::short_string_storage(&sStack_28,(short_string_storage *)other);
          (other->field_0).common_ = (this->field_0).common_;
          basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>
          ::short_string_storage::short_string_storage((short_string_storage *)this,&sStack_28);
          return;
        case 0xc:
          sVar5 = (other->field_0).common_.tag_;
          phVar7 = (other->field_0).long_str_.ptr_;
          phVar4 = (this->field_0).long_str_.ptr_;
          *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
          (other->field_0).long_str_.ptr_ = phVar4;
          (this->field_0).boolean_ = (bool_storage)0xc;
          break;
        case 0xd:
          sVar5 = (other->field_0).common_.tag_;
          phVar7 = (other->field_0).long_str_.ptr_;
          phVar4 = (this->field_0).long_str_.ptr_;
          *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
          (other->field_0).long_str_.ptr_ = phVar4;
          (this->field_0).boolean_ = (bool_storage)0xd;
          break;
        case 0xe:
          sVar5 = (other->field_0).common_.tag_;
          phVar7 = (other->field_0).long_str_.ptr_;
          phVar4 = (this->field_0).long_str_.ptr_;
          *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
          (other->field_0).long_str_.ptr_ = phVar4;
          (this->field_0).boolean_ = (bool_storage)0xe;
          break;
        case 0xf:
          sVar5 = (other->field_0).common_.tag_;
          phVar7 = (other->field_0).long_str_.ptr_;
          phVar4 = (this->field_0).long_str_.ptr_;
          *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
          (other->field_0).long_str_.ptr_ = phVar4;
          (this->field_0).boolean_ = (bool_storage)0xf;
        }
        (this->field_0).common_.tag_ = sVar5;
        (this->field_0).long_str_.ptr_ = phVar7;
        return;
      case 0xc:
        sVar5 = (other->field_0).common_.tag_;
        phVar7 = (other->field_0).long_str_.ptr_;
        phVar4 = (this->field_0).long_str_.ptr_;
        *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
        (other->field_0).long_str_.ptr_ = phVar4;
        (this->field_0).boolean_ = (bool_storage)0xc;
        break;
      case 0xd:
        sVar5 = (other->field_0).common_.tag_;
        phVar7 = (other->field_0).long_str_.ptr_;
        phVar4 = (this->field_0).long_str_.ptr_;
        *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
        (other->field_0).long_str_.ptr_ = phVar4;
        (this->field_0).boolean_ = (bool_storage)0xd;
        break;
      case 0xe:
        sVar5 = (other->field_0).common_.tag_;
        phVar7 = (other->field_0).long_str_.ptr_;
        phVar4 = (this->field_0).long_str_.ptr_;
        *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
        (other->field_0).long_str_.ptr_ = phVar4;
        (this->field_0).boolean_ = (bool_storage)0xe;
        break;
      case 0xf:
        sVar5 = (other->field_0).common_.tag_;
        phVar7 = (other->field_0).long_str_.ptr_;
        phVar4 = (this->field_0).long_str_.ptr_;
        *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
        (other->field_0).long_str_.ptr_ = phVar4;
        (this->field_0).boolean_ = (bool_storage)0xf;
      }
      (this->field_0).common_.tag_ = sVar5;
      (this->field_0).long_str_.ptr_ = phVar7;
      return;
    case 0xc:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::long_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage>
                ();
      return;
    case 0xd:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::long_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage>
                ();
      return;
    case 0xe:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::long_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage>
                ();
      return;
    case 0xf:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::long_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::long_string_storage>
                ();
      return;
    }
    (this->field_0).common_ = cVar6;
    return;
  case 0xc:
    sVar5 = (other->field_0).common_.tag_;
    phVar7 = (other->field_0).long_str_.ptr_;
    phVar4 = (this->field_0).long_str_.ptr_;
    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
    (other->field_0).long_str_.ptr_ = phVar4;
    (this->field_0).boolean_ = (bool_storage)0xc;
    break;
  case 0xd:
    sVar5 = (other->field_0).common_.tag_;
    phVar7 = (other->field_0).long_str_.ptr_;
    phVar4 = (this->field_0).long_str_.ptr_;
    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
    (other->field_0).long_str_.ptr_ = phVar4;
    (this->field_0).boolean_ = (bool_storage)0xd;
    break;
  case 0xe:
    sVar5 = (other->field_0).common_.tag_;
    phVar7 = (other->field_0).long_str_.ptr_;
    phVar4 = (this->field_0).long_str_.ptr_;
    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
    (other->field_0).long_str_.ptr_ = phVar4;
    (this->field_0).boolean_ = (bool_storage)0xe;
    break;
  case 0xf:
    sVar5 = (other->field_0).common_.tag_;
    phVar7 = (other->field_0).long_str_.ptr_;
    phVar4 = (this->field_0).long_str_.ptr_;
    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
    (other->field_0).long_str_.ptr_ = phVar4;
    (this->field_0).boolean_ = (bool_storage)0xf;
  }
  (this->field_0).common_.tag_ = sVar5;
  (this->field_0).long_str_.ptr_ = phVar7;
  return;
}

Assistant:

void swap_l(basic_json& other) noexcept
        {
            switch (other.storage_kind())
            {
                case json_storage_kind::null         : swap_l_r<TypeL, null_storage>(other); break;
                case json_storage_kind::empty_object : swap_l_r<TypeL, empty_object_storage>(other); break;
                case json_storage_kind::boolean         : swap_l_r<TypeL, bool_storage>(other); break;
                case json_storage_kind::int64        : swap_l_r<TypeL, int64_storage>(other); break;
                case json_storage_kind::uint64       : swap_l_r<TypeL, uint64_storage>(other); break;
                case json_storage_kind::half_float         : swap_l_r<TypeL, half_storage>(other); break;
                case json_storage_kind::float64       : swap_l_r<TypeL, double_storage>(other); break;
                case json_storage_kind::short_str : swap_l_r<TypeL, short_string_storage>(other); break;
                case json_storage_kind::long_str  : swap_l_r<TypeL, long_string_storage>(other); break;
                case json_storage_kind::byte_str  : swap_l_r<TypeL, byte_string_storage>(other); break;
                case json_storage_kind::array        : swap_l_r<TypeL, array_storage>(other); break;
                case json_storage_kind::object       : swap_l_r<TypeL, object_storage>(other); break;
                case json_storage_kind::json_const_reference : swap_l_r<TypeL, json_const_reference_storage>(other); break;
                case json_storage_kind::json_reference : swap_l_r<TypeL, json_reference_storage>(other); break;
                default:
                    JSONCONS_UNREACHABLE();
                    break;
            }
        }